

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCone.c
# Opt level: O1

void Opa_ManPerform(Gia_Man_t *pGia)

{
  uint uVar1;
  int iVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pGVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  Opa_Man_t *p;
  Vec_Int_t *p_00;
  int *__s;
  Vec_Int_t *p_01;
  int *piVar9;
  ulong uVar10;
  Vec_Int_t *pVVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  size_t __size;
  uint uVar17;
  int **ppiVar18;
  uint local_40;
  
  p = (Opa_Man_t *)calloc(1,0x28);
  p->pGia = pGia;
  pVVar11 = pGia->vCos;
  iVar14 = pGia->nRegs;
  p_00 = (Vec_Int_t *)calloc((long)pVVar11->nSize - (long)iVar14,0x10);
  p->pvParts = p_00;
  __size = (long)pGia->nObjs << 2;
  __s = (int *)malloc(__size);
  memset(__s,0xff,__size);
  p->pId2Part = __s;
  p_01 = (Vec_Int_t *)malloc(0x10);
  p_01->nCap = 100;
  p_01->nSize = 0;
  piVar9 = (int *)malloc(400);
  p_01->pArray = piVar9;
  p->vFront = p_01;
  uVar1 = pVVar11->nSize;
  uVar12 = (ulong)uVar1;
  uVar10 = (ulong)(uVar1 - iVar14);
  if (uVar1 - iVar14 != 0 && iVar14 <= (int)uVar1) {
    lVar13 = 0;
    do {
      if ((int)uVar12 <= lVar13) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar14 = pVVar11->pArray[lVar13];
      if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) goto LAB_0070ea4e;
      if (pGia->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar4 = pGia->pObjs + iVar14;
      Vec_IntPush(p_00,iVar14);
      pGVar3 = pGia->pObjs;
      if ((pGVar4 < pGVar3) || (pGVar3 + pGia->nObjs <= pGVar4)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      iVar14 = (int)((long)pGVar4 - (long)pGVar3 >> 2) * -0x55555555;
      __s[iVar14] = (int)lVar13;
      Vec_IntPush(p_01,iVar14);
      lVar13 = lVar13 + 1;
      pVVar11 = pGia->vCos;
      uVar12 = (ulong)pVVar11->nSize;
      uVar10 = uVar12 - (long)pGia->nRegs;
      p_00 = p_00 + 1;
    } while (lVar13 < (long)uVar10);
  }
  p->nParts = (int)uVar10;
  pVVar11 = p->vFront;
  if (pVVar11->nSize < 1) {
LAB_0070e986:
    putchar(10);
    pVVar11 = p->vFront;
    if (pVVar11->pArray != (int *)0x0) {
      free(pVVar11->pArray);
      pVVar11->pArray = (int *)0x0;
    }
    if (pVVar11 != (Vec_Int_t *)0x0) {
      free(pVVar11);
    }
    pGVar5 = p->pGia;
    if (pGVar5->nRegs < pGVar5->vCos->nSize) {
      ppiVar18 = &p->pvParts->pArray;
      lVar13 = 0;
      do {
        if (*ppiVar18 != (int *)0x0) {
          free(*ppiVar18);
          *ppiVar18 = (int *)0x0;
        }
        lVar13 = lVar13 + 1;
        ppiVar18 = ppiVar18 + 2;
      } while (lVar13 < (long)pGVar5->vCos->nSize - (long)pGVar5->nRegs);
    }
    if (p->pvParts != (Vec_Int_t *)0x0) {
      free(p->pvParts);
      p->pvParts = (Vec_Int_t *)0x0;
    }
    if (p->pId2Part != (int *)0x0) {
      free(p->pId2Part);
      p->pId2Part = (int *)0x0;
    }
    free(p);
    return;
  }
  local_40 = p_01->nSize;
  uVar10 = 0;
  uVar1 = 0;
  do {
    iVar14 = pVVar11->pArray[uVar10];
    if (((long)iVar14 < 0) || (pGia->nObjs <= iVar14)) {
LAB_0070ea4e:
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar4 = pGia->pObjs;
    if (pGVar4 == (Gia_Obj_t *)0x0) goto LAB_0070e986;
    if (uVar10 == local_40) {
      uVar17 = uVar1 + 1;
      uVar8 = p->nParts;
      printf("%6d : %6d -> %6d\n",(ulong)uVar17,uVar10 & 0xffffffff);
      local_40 = pVVar11->nSize;
      bVar7 = 0 < (int)uVar1;
      uVar1 = uVar17;
      if (bVar7) {
        printf("Groups %d: ",(ulong)uVar8);
        pGVar5 = p->pGia;
        iVar2 = pGVar5->vCos->nSize;
        uVar8 = iVar2 - pGVar5->nRegs;
        uVar12 = (ulong)uVar8;
        if (uVar8 != 0 && pGVar5->nRegs <= iVar2) {
          pVVar11 = p->pvParts;
          lVar13 = 0;
          do {
            if (pVVar11[lVar13].nSize != 0) {
              if ((long)pVVar11[lVar13].nSize < 1) {
                uVar15 = 0;
              }
              else {
                lVar16 = 0;
                uVar15 = 0;
                do {
                  iVar2 = pVVar11[lVar13].pArray[lVar16];
                  if (((long)iVar2 < 0) || (pGVar5->nObjs <= iVar2)) goto LAB_0070ea4e;
                  if (pGVar5->pObjs == (Gia_Obj_t *)0x0) break;
                  uVar6 = *(undefined8 *)(pGVar5->pObjs + iVar2);
                  uVar8 = (uint)uVar6;
                  uVar15 = (ulong)((int)uVar15 +
                                  (uint)(((~uVar8 & 0x1fffffff) != 0 && (int)uVar8 < 0) &&
                                        (int)((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff) <
                                        (int)uVar12));
                  lVar16 = lVar16 + 1;
                } while (pVVar11[lVar13].nSize != lVar16);
              }
              printf("%d ",uVar15);
            }
            lVar13 = lVar13 + 1;
            uVar12 = (long)pGVar5->vCos->nSize - (long)pGVar5->nRegs;
          } while (lVar13 < (long)uVar12);
        }
        putchar(10);
      }
    }
    pGVar4 = pGVar4 + iVar14;
    iVar14 = (int)*(ulong *)pGVar4;
    uVar12 = *(ulong *)pGVar4 & 0x1fffffff;
    if (uVar12 == 0x1fffffff || iVar14 < 0) {
      if ((-1 < iVar14) || ((int)uVar12 == 0x1fffffff)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCone.c"
                      ,0xc5,"void Opa_ManPerform(Gia_Man_t *)");
      }
    }
    else {
      Opa_ManMoveOne(p,pGVar4,pGVar4 + -uVar12);
      uVar12 = (ulong)(*(uint *)&pGVar4->field_0x4 & 0x1fffffff);
    }
    Opa_ManMoveOne(p,pGVar4,pGVar4 + -uVar12);
    if ((p->nParts == 1) || (uVar1 == 5)) goto LAB_0070e986;
    uVar10 = uVar10 + 1;
    pVVar11 = p->vFront;
    if ((long)pVVar11->nSize <= (long)uVar10) goto LAB_0070e986;
  } while( true );
}

Assistant:

void Opa_ManPerform( Gia_Man_t * pGia )
{
    Opa_Man_t * p;
    Gia_Obj_t * pObj;
    int i, Limit, Count = 0;
 
    p = Opa_ManStart( pGia );
    Limit = Vec_IntSize(p->vFront);
//Opa_ManPrint2( p );
    Gia_ManForEachObjVec( p->vFront, pGia, pObj, i )
    {
        if ( i == Limit )
        {
            printf( "%6d : %6d -> %6d\n", ++Count, i, p->nParts );
            Limit = Vec_IntSize(p->vFront);
            if ( Count > 1 )
                Opa_ManPrint2( p );
        }
//        printf( "*** Object %d  ", Gia_ObjId(pGia, pObj) );
        if ( Gia_ObjIsAnd(pObj) )
        {
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin1(pObj) );
        }
        else if ( Gia_ObjIsCo(pObj) )
            Opa_ManMoveOne( p, pObj, Gia_ObjFanin0(pObj) );
        else assert( 0 );
//        if ( i % 10 == 0 )
//            printf( "%d   ", p->nParts );
        if ( p->nParts == 1 )
            break;
        if ( Count == 5 )
            break;
    }
    printf( "\n" );
    Opa_ManStop( p );
}